

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int grapg_5_3::dfs(graph g,int v)

{
  int v_00;
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  graph in_stack_fffffffffffffe88;
  undefined8 local_c0 [21];
  enode *local_18;
  enode *e;
  int v_local;
  
  bVar5 = 0;
  e._4_4_ = v;
  *(undefined4 *)(visited + (long)v * 4) = 1;
  for (local_18 = g.vexs[v].edge; local_18 != (enode *)0x0; local_18 = local_18->next) {
    if (*(int *)(visited + (long)local_18->adjvex * 4) == 0) {
      memcpy(local_c0,&g,0xa8);
      v_00 = local_18->adjvex;
      puVar3 = local_c0;
      puVar4 = (undefined8 *)&stack0xfffffffffffffe88;
      for (lVar2 = 0x15; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      dfs(in_stack_fffffffffffffe88,v_00);
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int dfs(graph g, int v) {
        visited[v] = 1;
        //visit;
        enode *e = g.vexs[v].edge;
        while (e != nullptr) {
            if (visited[e->adjvex] == 0)
                dfs(g, e->adjvex);
            e = e->next;
        }
    }